

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

void __thiscall Selector::~Selector(Selector *this)

{
  Node *pNVar1;
  Node *pNVar2;
  bool bVar3;
  Thread *t;
  int in_EDX;
  int in_ESI;
  
  (this->super_EventDispatcher).super_IEventDispatcher._vptr_IEventDispatcher =
       (_func_int **)&PTR_sendEventSync_00130750;
  shutdown(this,in_ESI,in_EDX);
  close(this->mPipe[1]);
  close(this->mPipe[0]);
  t = JHThread::Thread::GetCurrent();
  bVar3 = JHThread::Thread::operator==(&(this->mThread).super_Thread,t);
  if (bVar3) {
    jh_log_print(1,"virtual Selector::~Selector()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                 ,0x46,"A selector MUST NOT be deleted by its own thread!");
  }
  Condition::~Condition(&this->mCondition);
  JHThread::Thread::~Thread(&(this->mThread).super_Thread);
  Mutex::~Mutex(&this->mLock);
  pNVar2 = (this->mList).mHead;
  while (pNVar2 != (Node *)0x0) {
    pNVar1 = pNVar2->next;
    operator_delete(pNVar2,0x18);
    (this->mList).mHead = pNVar1;
    pNVar2 = pNVar1;
  }
  (this->mList).mTail = (Node *)0x0;
  EventDispatcher::~EventDispatcher(&this->super_EventDispatcher);
  return;
}

Assistant:

Selector::~Selector()
{
	TRACE_BEGIN( LOG_LVL_INFO );

	shutdown();
	
	LOG( "Closing pipes" );
	// close the pipes fd's.
	close( mPipe[ PIPE_WRITER ] );
	close( mPipe[ PIPE_READER ] );

	if ( mThread == *Thread::GetCurrent() )
		LOG_ERR_FATAL( "A selector MUST NOT be deleted by its own thread!" );
}